

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1chord_angle.cc
# Opt level: O0

double cos(double __x)

{
  bool bVar1;
  ostream *poVar2;
  double dVar3;
  S2LogMessage local_28;
  S2LogMessageVoidify local_11;
  S1ChordAngle local_10;
  S1ChordAngle a_local;
  
  local_10.length2_ = __x;
  bVar1 = S1ChordAngle::is_special(&local_10);
  if (!bVar1) {
    dVar3 = S1ChordAngle::length2(&local_10);
    return 1.0 - dVar3 * 0.5;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.cc"
             ,0x95,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_28);
  poVar2 = std::operator<<(poVar2,"Check failed: !a.is_special() ");
  S2LogMessageVoidify::operator&(&local_11,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

double cos(S1ChordAngle a) {
  // cos(2*A) = cos^2(A) - sin^2(A) = 1 - 2*sin^2(A)
  S2_DCHECK(!a.is_special());
  return 1 - 0.5 * a.length2();
}